

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_matrix.cc
# Opt level: O0

void __thiscall sptk::SymmetricMatrix::SymmetricMatrix(SymmetricMatrix *this,int num_dimension)

{
  reference pvVar1;
  reference ppdVar2;
  int in_ESI;
  undefined8 *in_RDI;
  int j;
  int i;
  int local_3c;
  vector<double,_std::allocator<double>_> *this_00;
  int local_24;
  int local_20;
  
  *in_RDI = &PTR__SymmetricMatrix_00126d58;
  this_00 = (vector<double,_std::allocator<double>_> *)(in_RDI + 1);
  local_3c = in_ESI;
  if (in_ESI < 0) {
    local_3c = 0;
  }
  *(int *)&(this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start = local_3c;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11ae03);
  std::vector<double_*,_std::allocator<double_*>_>::vector
            ((vector<double_*,_std::allocator<double_*>_> *)0x11ae16);
  std::vector<double,_std::allocator<double>_>::resize(this_00,(size_type)in_RDI);
  std::vector<double_*,_std::allocator<double_*>_>::resize
            ((vector<double_*,_std::allocator<double_*>_> *)this_00,(size_type)in_RDI);
  local_20 = 0;
  local_24 = 0;
  while (local_20 < *(int *)(in_RDI + 1)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_24);
    ppdVar2 = std::vector<double_*,_std::allocator<double_*>_>::operator[]
                        ((vector<double_*,_std::allocator<double_*>_> *)(in_RDI + 5),(long)local_20)
    ;
    *ppdVar2 = pvVar1;
    local_20 = local_20 + 1;
    local_24 = local_20 + local_24;
  }
  return;
}

Assistant:

SymmetricMatrix::SymmetricMatrix(int num_dimension)
    : num_dimension_(num_dimension < 0 ? 0 : num_dimension) {
  data_.resize(num_dimension_ * (num_dimension_ + 1) / 2);
  index_.resize(num_dimension_);

  for (int i(0), j(0); i < num_dimension_; ++i, j += i) {
    index_[i] = &data_[j];
  }
}